

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O1

String * __thiscall
kj::_::concat<kj::ArrayPtr<char_const>,kj::_::Delimited<kj::ArrayPtr<unsigned_char_const>>>
          (String *__return_storage_ptr__,_ *this,ArrayPtr<const_char> *params,
          Delimited<kj::ArrayPtr<const_unsigned_char>_> *params_1)

{
  long lVar1;
  size_t size;
  char *target;
  long local_28 [2];
  
  local_28[0] = *(long *)(this + 8);
  local_28[1] = Delimited<kj::ArrayPtr<const_unsigned_char>_>::size
                          ((Delimited<kj::ArrayPtr<const_unsigned_char>_> *)params);
  size = 0;
  lVar1 = 0;
  do {
    size = size + *(long *)((long)local_28 + lVar1);
    lVar1 = lVar1 + 8;
  } while (lVar1 != 0x10);
  heapString(__return_storage_ptr__,size);
  target = (char *)(__return_storage_ptr__->content).size_;
  if (target != (char *)0x0) {
    target = (__return_storage_ptr__->content).ptr;
  }
  fill<kj::ArrayPtr<char_const>,kj::_::Delimited<kj::ArrayPtr<unsigned_char_const>>>
            (target,(ArrayPtr<const_char> *)this,
             (Delimited<kj::ArrayPtr<const_unsigned_char>_> *)params);
  return __return_storage_ptr__;
}

Assistant:

String concat(Params&&... params) {
  // Concatenate a bunch of containers into a single Array.  The containers can be anything that
  // is iterable and whose elements can be converted to `char`.

  String result = heapString(sum({params.size()...}));
  fill(result.begin(), kj::fwd<Params>(params)...);
  return result;
}